

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_1fe6b52::Pipe::write(Pipe *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  size_type sVar2;
  undefined8 unaff_RBX;
  undefined4 in_register_00000034;
  uchar *__args;
  bool bVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  __args = (uchar *)CONCAT44(in_register_00000034,__fd);
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex);
  bVar1 = this->closed;
  if (__buf != (void *)0x0 && bVar1 == false) {
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    while (bVar3 = __buf != (void *)0x0, __buf = (void *)((long)__buf + -1), bVar3) {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&this->data,__args);
      __args = __args + 1;
    }
    if (sVar2 == 0) {
      std::condition_variable::notify_all();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar1) ^ 1) & 0xffffffff;
}

Assistant:

bool write(const void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    if (closed) {
      return false;
    }
    if (bytes == 0) {
      return true;
    }
    auto notify = data.size() == 0;
    auto src = reinterpret_cast<const uint8_t*>(buffer);
    for (size_t i = 0; i < bytes; i++) {
      data.emplace_back(src[i]);
    }
    if (notify) {
      cv.notify_all();
    }
    return true;
  }